

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O2

int __thiscall
FastPForLib::VarIntG8IU::encodeBlock
          (VarIntG8IU *this,uint32_t **src,size_t *srclength,uchar **dest,size_t *dstlength)

{
  size_t sVar1;
  uint32_t *puVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint auStack_78 [8];
  uint auStack_58 [4];
  int ithSize [8];
  uint32_t buffer [8];
  
  sVar1 = *srclength;
  puVar2 = *src;
  bVar9 = 0xff;
  uVar12 = 1;
  lVar3 = 0;
  uVar14 = 0;
  sVar7 = sVar1;
  for (lVar5 = 4; sVar7 = sVar7 - 4, lVar5 - sVar1 != 4; lVar5 = lVar5 + 4) {
    uVar4 = puVar2[lVar3];
    uVar6 = (uint)LZCOUNT(uVar4 | 0xff) >> 3;
    uVar11 = 4 - uVar6;
    uVar14 = uVar14 + uVar11;
    if (8 < uVar14) break;
    auStack_58[lVar3] = uVar4;
    auStack_78[lVar3] = uVar11;
    lVar3 = lVar3 + 1;
    iVar13 = (uVar12 & 0xff) << ((byte)uVar6 ^ 3);
    *src = (uint32_t *)((long)puVar2 + lVar5);
    *srclength = sVar7;
    bVar9 = bVar9 ^ (byte)iVar13;
    uVar12 = iVar13 * 2;
  }
  **dest = bVar9;
  iVar13 = 1;
  for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
    uVar12 = auStack_78[lVar5];
    uVar14 = auStack_58[lVar5];
    lVar8 = (long)iVar13;
    uVar4 = 0;
    for (iVar10 = 0; -(~((int)uVar12 >> 0x1f) & uVar12) != iVar10; iVar10 = iVar10 + -1) {
      uVar6 = uVar4 & 0x1f;
      uVar4 = uVar4 + 8;
      (*dest)[lVar8] = (uchar)(uVar14 >> uVar6);
      lVar8 = lVar8 + 1;
    }
    iVar13 = iVar13 - iVar10;
  }
  for (lVar3 = (long)iVar13; lVar3 < 9; lVar3 = lVar3 + 1) {
    (*dest)[lVar3] = '\0';
  }
  *dest = *dest + 9;
  *dstlength = *dstlength - 9;
  return 9;
}

Assistant:

int encodeBlock(const uint32_t *&src, size_t &srclength, unsigned char *&dest,
                  size_t &dstlength) {
    unsigned char desc = 0xFF;
    unsigned char bitmask = 0x01;
    uint32_t buffer[8];
    int ithSize[8];
    int length = 0;
    int numInt = 0;

    while (srclength > 0) {
      const uint32_t *temp = src;
      int byteNeeded = getNumByteNeeded(*temp);

      if (PREDICT_FALSE(length + byteNeeded > 8)) {
        break;
      }

      // flip the correct bit in desc
      bitmask = static_cast<unsigned char>(bitmask << (byteNeeded - 1));
      desc = desc ^ bitmask;
      bitmask = static_cast<unsigned char>(bitmask << 1);

      ithSize[numInt] = byteNeeded;
      length += byteNeeded;
      buffer[numInt] = *temp;
      src = src + 1;
      srclength -= 4;
      numInt++;
    }

    dest[0] = desc;
    int written = 1;
    for (int i = 0; i < numInt; i++) {
      int size = ithSize[i];
      uint32_t value = buffer[i];
      for (int j = 0; j < size; j++) {
        dest[written] = static_cast<unsigned char>(value >> (j * 8));
        written++;
      }
    }
    while (written < 9) {
      dest[written++] = 0; // clear padding bytes
    }
    dest += 9;
    dstlength -= 9;
    return 9;
  }